

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drandmea.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  bool bVar5;
  double dVar6;
  double dVar7;
  double local_58;
  double local_50;
  double local_40;
  undefined8 local_38;
  
  if (argc - 7U < 0xfffffffe) {
    main_cold_4();
    return 1;
  }
  iVar1 = atoi(argv[1]);
  if (iVar1 < 1) {
    main_cold_3();
LAB_001013d9:
    iVar1 = 2;
  }
  else {
    iVar2 = atoi(argv[2]);
    if (argc == 5) {
      if (iVar2 < 1) {
        main_cold_2();
        goto LAB_001013d9;
      }
      local_50 = atof(argv[3]);
      local_58 = atof(argv[4]);
      dVar6 = 0.0;
      local_40 = 0.0;
    }
    else {
      iVar3 = atoi(argv[3]);
      if ((iVar2 < 1) || (iVar3 < 1)) {
        main_cold_1();
        goto LAB_001013d9;
      }
      local_50 = atof(argv[4]);
      local_58 = atof(argv[5]);
      local_40 = (double)iVar2;
      dVar6 = (double)(iVar3 + 1);
    }
    reset_rand();
    local_38 = rand_unified(local_50,local_58);
    if (argc == 6) {
      dVar7 = (double)rand_unified(local_40,dVar6);
      iVar2 = 1;
      if (1 < (int)dVar7) {
        iVar2 = (int)dVar7;
      }
    }
    iVar3 = 0;
    do {
      iVar4 = 0;
      if (0 < iVar2) {
        iVar4 = iVar2;
      }
      while (bVar5 = iVar4 != 0, iVar4 = iVar4 + -1, bVar5) {
        printf("%g\n",local_38);
        iVar3 = iVar3 + 1;
        if (iVar1 <= iVar3) goto LAB_001013a9;
      }
      local_38 = rand_unified(local_50,local_58);
      if (argc == 6) {
        dVar7 = (double)rand_unified(local_40,dVar6);
        iVar2 = (int)dVar7;
        if (iVar2 < 2) {
          iVar2 = 1;
        }
      }
    } while (iVar3 < iVar1);
LAB_001013a9:
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int main (int argc, char* argv[])
{
  if(argc != 5 && argc != 6)
    {
      fprintf(stderr,
	      "Usage: drandmea Length HalfPeriod MinAmpl MaxAmpl\n"\
	      "   or  drandmea Length MinHalfPer MaxHalfPer MinAmpl MaxAmpl\n"\
	      "DRAND_SAFE=something to avoid the same seed in srand()\n");
      return 1;
    }

  double	fMinAmpl, fMaxAmpl;
  int		nLength, nHalfPeriod, nMinHalfPer, nMaxHalfPer;

  nLength = atoi(argv[1]);
  if(nLength <= 0)
    {
      fprintf(stderr, "Length must be positive\n");
      return 2;
    }

  if(argc == 5)
    {
      nHalfPeriod = atoi(argv[2]);
      if(nHalfPeriod <= 0)
	{
	  fprintf(stderr, "HalfPeriod must be positive\n");
	  return 2;
	}
      fMinAmpl = atof(argv[3]);
      fMaxAmpl = atof(argv[4]);
    }
  else
    {
      nMinHalfPer = atoi(argv[2]);
      nMaxHalfPer = atoi(argv[3]);
      if(nMinHalfPer <= 0 || nMaxHalfPer <= 0)
	{
	  fprintf(stderr, "MinHalfPer and nMaxHalfPer must be positive\n");
	  return 2;
	}
      fMinAmpl = atof(argv[4]);
      fMaxAmpl = atof(argv[5]);
    }

  // See DRAND_SAFE to prevent dependent random series
  reset_rand();

  NaReal	fAmpl = rand_unified(fMinAmpl, fMaxAmpl);
  if(argc == 6)
    {
      nHalfPeriod = rand_unified(nMinHalfPer, nMaxHalfPer + 1);
      if(nHalfPeriod <= 0)
	nHalfPeriod = 1;
    }

  int		i = 0, j = 0;
  while(i < nLength)
    {
      if(j < nHalfPeriod)
	{
	  printf("%g\n", fAmpl);
	  ++j;
	}
      else
	{
	  fAmpl = rand_unified(fMinAmpl, fMaxAmpl);
	  if(argc == 6)
	    {
	      nHalfPeriod = rand_unified(nMinHalfPer, nMaxHalfPer + 1);
	      if(nHalfPeriod <= 0)
		nHalfPeriod = 1;
	    }
	  j = 0;
	  continue;
	}
      ++i;
    }

  return 0;
}